

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O1

void Commands::SpawnItem(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *arguments,Character *from)

{
  pointer pbVar1;
  bool bVar2;
  int num;
  int amount;
  PacketBuilder reply;
  PacketBuilder local_50;
  
  num = util::to_int((arguments->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
  pbVar1 = (arguments->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  amount = 1;
  if (0x20 < (ulong)((long)(arguments->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) {
    amount = util::to_int(pbVar1 + 1);
  }
  bVar2 = Character::AddItem(from,(short)num,amount);
  if (bVar2) {
    PacketBuilder::PacketBuilder(&local_50,PACKET_ITEM,PACKET_GET,9);
    PacketBuilder::AddShort(&local_50,0);
    PacketBuilder::AddShort(&local_50,num);
    PacketBuilder::AddThree(&local_50,amount);
    PacketBuilder::AddChar(&local_50,from->weight);
    PacketBuilder::AddChar(&local_50,from->maxweight);
    Character::Send(from,&local_50);
    PacketBuilder::~PacketBuilder(&local_50);
  }
  return;
}

Assistant:

void SpawnItem(const std::vector<std::string>& arguments, Character* from)
{
	int id = util::to_int(arguments[0]);
	int amount = (arguments.size() >= 2) ? util::to_int(arguments[1]) : 1;

	if (from->AddItem(id, amount))
	{
		PacketBuilder reply(PACKET_ITEM, PACKET_GET, 9);
		reply.AddShort(0); // UID
		reply.AddShort(id);
		reply.AddThree(amount);
		reply.AddChar(from->weight);
		reply.AddChar(from->maxweight);
		from->Send(reply);
	}
}